

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound.cpp
# Opt level: O3

YSRESULT __thiscall YsSoundPlayer::SoundData::Resample(SoundData *this,int newRate)

{
  uint uVar1;
  YSBOOL YVar2;
  ulong uVar3;
  int atTimeStep;
  bool bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  uchar *local_c8;
  
  uVar1 = this->rate;
  if (uVar1 != newRate) {
    YVar2 = this->stereo;
    uVar9 = (ulong)(this->bit >> 3);
    uVar12 = uVar9 << (YVar2 == YSTRUE);
    local_c8 = (uchar *)0x0;
    uVar3 = (ulong)this->sizeInBytes / (uVar12 & 0xffffffff);
    uVar10 = ((long)newRate * uVar3) / (ulong)uVar1;
    uVar13 = uVar10 * uVar12;
    if ((uVar13 != 0) &&
       (local_c8 = (uchar *)operator_new__(uVar13), (ulong)uVar1 <= (long)newRate * uVar3)) {
      uVar15 = 0;
      do {
        auVar21._8_4_ = (int)(uVar15 >> 0x20);
        auVar21._0_8_ = uVar15;
        auVar21._12_4_ = 0x45300000;
        dVar16 = (((auVar21._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0)) * (double)uVar3)
                 / (((double)CONCAT44(0x45300000,(int)(uVar10 >> 0x20)) - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0));
        uVar11 = (long)(dVar16 - 9.223372036854776e+18) & (long)dVar16 >> 0x3f | (long)dVar16;
        dVar16 = fmod(dVar16,1.0);
        atTimeStep = (int)uVar11;
        bVar5 = 1;
        lVar14 = 0;
        do {
          iVar8 = (int)lVar14;
          if (uVar11 < uVar3 - 1) {
            if (uVar11 < uVar3 - 2 && uVar11 != 0) {
              iVar6 = GetSignedValueRaw(this,iVar8,atTimeStep + -1);
              iVar7 = GetSignedValueRaw(this,iVar8,atTimeStep);
              dVar17 = (double)iVar7;
              iVar7 = GetSignedValueRaw(this,iVar8,atTimeStep + 1);
              dVar18 = (double)iVar7;
              iVar8 = GetSignedValueRaw(this,iVar8,atTimeStep + 2);
              dVar20 = ((double)(iVar6 + iVar7) - (dVar17 + dVar17)) * 0.5;
              dVar19 = ((((double)iVar8 - (dVar18 + dVar18)) - (dVar20 + dVar20)) + dVar17) / 6.0;
              dVar17 = (((dVar18 - dVar19) - dVar20) - dVar17) * dVar16 +
                       dVar19 * dVar16 * dVar16 * dVar16 + dVar20 * dVar16 * dVar16 + dVar17;
            }
            else {
              iVar6 = GetSignedValueRaw(this,iVar8,atTimeStep);
              iVar8 = GetSignedValueRaw(this,iVar8,atTimeStep + 1);
              dVar17 = (double)iVar8 * dVar16 + (double)iVar6 * (1.0 - dVar16);
            }
            iVar8 = (int)dVar17;
          }
          else {
            iVar8 = GetSignedValueRaw(this,iVar8,(int)(uVar3 - 1));
          }
          SetSignedValueRaw(this,local_c8 + lVar14 * uVar9 + uVar15 * uVar12,iVar8);
          lVar14 = 1;
          bVar4 = (bool)(YVar2 == YSTRUE & bVar5);
          bVar5 = 0;
        } while (bVar4);
        uVar15 = uVar15 + 1;
      } while (uVar15 < uVar10);
    }
    this->rate = newRate;
    if (this->dat != (uchar *)0x0) {
      operator_delete__(this->dat);
    }
    this->dat = local_c8;
    this->sizeInBytes = (uint)uVar13;
  }
  return YSOK;
}

Assistant:

YSRESULT YsSoundPlayer::SoundData::Resample(int newRate)
{
	if(rate!=newRate)
	{
		const size_t nChannel=(YSTRUE==stereo ? 2 : 1);
		const size_t bytePerSample=bit/8;
		const size_t bytePerTimeStep=nChannel*bytePerSample;
		const size_t curNTimeStep=sizeInBytes/bytePerTimeStep;

		const size_t newNTimeStep=curNTimeStep*newRate/rate;
		const size_t newSize=newNTimeStep*bytePerTimeStep;

		unsigned char *newDat=(0<newSize ? new unsigned char [newSize] : NULL);
		if(NULL!=newDat)
		{
			for(size_t ts=0; ts<newNTimeStep; ts++)
			{
				double oldTimeStepD=(double)curNTimeStep*(double)ts/(double)newNTimeStep;
				size_t oldTimeStep=(size_t)oldTimeStepD;
				double param=fmod(oldTimeStepD,1.0);
				unsigned char *newTimeStepPtr=newDat+ts*bytePerTimeStep;

				for(size_t ch=0; ch<nChannel; ++ch)
				{
					if(curNTimeStep-1<=oldTimeStep)
					{
						const int value=GetSignedValueRaw(ch,curNTimeStep-1);
						SetSignedValueRaw(newTimeStepPtr+bytePerSample*ch,value);
					}
					else if(0==oldTimeStep || curNTimeStep-2<=oldTimeStep)
					{
						const double value[2]=
							{
								(double)GetSignedValueRaw(ch,oldTimeStep),
								(double)GetSignedValueRaw(ch,oldTimeStep+1)
							};
						const int newValue=(int)(value[0]*(1.0-param)+value[1]*param);
						SetSignedValueRaw(newTimeStepPtr+bytePerSample*ch,newValue);
					}
					else
					{
						const double v[4]=
							{
								(double)GetSignedValueRaw(ch,oldTimeStep-1),  // At x=-1.0
								(double)GetSignedValueRaw(ch,oldTimeStep),    // At x= 0.0
								(double)GetSignedValueRaw(ch,oldTimeStep+1),  // At x= 1.0
								(double)GetSignedValueRaw(ch,oldTimeStep+2)   // At x= 2.0
							};

						// Cubic interpolation.  Linear didn't work well.
						// axxx+bxx+cx+d=e
						// x=-1  -> -a+b-c+d=v0   (A)
						// x= 0  ->        d=v1   (B)
						// x= 1  ->  a+b+c+d=v2   (C)
						// x= 2  -> 8a+4b+2c+d=v3 (D)
						//
						// (B) =>  d=v1;
						// (A)+(C) => 2b+2d=v0+v2  => b=(v0+v2-2d)/2
						//
						// (D)-2*(B) =>  6a+2b-d=v3-2*v2
						//           =>  a=(v3-2*v2-2b+d)/6

						const double d=v[1];
						const double b=(v[0]+v[2]-2.0*d)/2.0;
						const double a=(v[3]-2.0*v[2]-2.0*b+d)/6.0;
						const double c=v[2]-a-b-d;

						double newValue=a*param*param*param
							+b*param*param
							+c*param
							+d;
						SetSignedValueRaw(newTimeStepPtr+bytePerSample*ch,(int)newValue);
					}
				}
			}
		}

		rate=newRate;
		delete [] dat;
		dat=newDat;
		sizeInBytes=newSize;
	}
	return YSOK;
}